

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

__m128i dc_sum_32(uint16_t *ref)

{
  __m128i alVar1;
  __m128i sum_b;
  __m128i sum_a;
  __m128i zero;
  uint16_t *ref_00;
  
  ref_00 = (uint16_t *)0x0;
  dc_sum_16((uint16_t *)0x0);
  alVar1 = dc_sum_16(ref_00);
  alVar1[0] = alVar1[0];
  alVar1[1] = alVar1[1];
  return alVar1;
}

Assistant:

static inline __m256i dc_sum_32(const uint8_t *ref) {
  const __m256i x = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i zero = _mm256_setzero_si256();
  __m256i y = _mm256_sad_epu8(x, zero);
  __m256i u = _mm256_permute2x128_si256(y, y, 1);
  y = _mm256_add_epi64(u, y);
  u = _mm256_unpackhi_epi64(y, y);
  return _mm256_add_epi16(y, u);
}